

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cc
# Opt level: O3

void gutil::trim(string *s)

{
  pointer pcVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  size_type sVar5;
  size_type sVar6;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  sVar6 = s->_M_string_length;
  if (sVar6 == 0) {
    sVar6 = 0;
  }
  else {
    pcVar1 = (s->_M_dataplus)._M_p;
    sVar5 = 0;
    do {
      iVar3 = isspace((int)pcVar1[sVar5]);
      if (iVar3 == 0) {
        if (sVar5 == 0) goto LAB_0015d3bc;
        break;
      }
      sVar5 = sVar5 + 1;
    } while (sVar6 != sVar5);
    std::__cxx11::string::substr((ulong)local_48,(ulong)s);
    std::__cxx11::string::operator=((string *)s,(string *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
    sVar6 = s->_M_string_length;
  }
LAB_0015d3bc:
  pcVar1 = (s->_M_dataplus)._M_p;
  uVar2 = sVar6;
  do {
    uVar4 = uVar2;
    if (uVar4 == 0) break;
    iVar3 = isspace((int)pcVar1[uVar4 - 1]);
    uVar2 = uVar4 - 1;
  } while (iVar3 != 0);
  if (uVar4 < sVar6) {
    std::__cxx11::string::substr((ulong)local_48,(ulong)s);
    std::__cxx11::string::operator=((string *)s,(string *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  return;
}

Assistant:

void gutil::trim(std::string &s)
{
  size_t pos;

  pos=0;

  while (pos < s.size() && isspace(s[pos]))
  {
    pos++;
  }

  if (pos > 0)
  {
    s=s.substr(pos);
  }

  pos=s.size();

  while (pos > 0 && isspace(s[pos-1]))
  {
    pos--;
  }

  if (pos < s.size())
  {
    s=s.substr(0, pos);
  }
}